

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall google::protobuf::Arena::SlowAlloc(Arena *this,size_t n)

{
  undefined8 *me;
  long lVar1;
  Block *pBVar2;
  size_t sVar3;
  size_t max_block_size;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  me = (undefined8 *)(lVar1 + -0x10);
  pBVar2 = *(Block **)(this + 8);
  do {
    if (pBVar2 == (Block *)0x0) {
      sVar3 = *(size_t *)(this + 0x40);
      max_block_size = *(size_t *)(this + 0x48);
      pBVar2 = (Block *)0x0;
LAB_0031b29d:
      pBVar2 = NewBlock(this,me,pBVar2,n,sVar3,max_block_size);
      AddBlock(this,pBVar2);
      *(Block **)(lVar1 + -8) = pBVar2;
      *me = *(undefined8 *)this;
      return pBVar2 + 1;
    }
    if ((undefined8 *)pBVar2->owner == me) {
      if (n <= pBVar2->size - pBVar2->pos) {
        *(Block **)(lVar1 + -8) = pBVar2;
        *me = *(undefined8 *)this;
        *(Block **)(this + 0x10) = pBVar2;
        sVar3 = pBVar2->pos;
        pBVar2->pos = n + sVar3;
        return (void *)((long)&pBVar2->owner + sVar3);
      }
      sVar3 = *(size_t *)(this + 0x40);
      max_block_size = *(size_t *)(this + 0x48);
      goto LAB_0031b29d;
    }
    pBVar2 = pBVar2->next;
  } while( true );
}

Assistant:

void* Arena::SlowAlloc(size_t n) {
  void* me = &thread_cache();
  Block* b = FindBlock(me);  // Find block owned by me.
  // See if allocation fits in my latest block.
  if (b != NULL && b->avail() >= n) {
    SetThreadCacheBlock(b);
    google::protobuf::internal::NoBarrier_Store(&hint_, reinterpret_cast<google::protobuf::internal::AtomicWord>(b));
    return AllocFromBlock(b, n);
  }
  b = NewBlock(me, b, n, options_.start_block_size, options_.max_block_size);
  AddBlock(b);
  SetThreadCacheBlock(b);
  return reinterpret_cast<char*>(b) + kHeaderSize;
}